

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkPrintFactor(FILE *pFile,Abc_Ntk_t *pNtk,int fUseRealNames)

{
  Abc_Obj_t *pNode;
  int i;
  
  if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
      pNode = Abc_NtkObj(pNtk,i);
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Abc_NodePrintFactor(pFile,pNode,fUseRealNames);
      }
    }
    return;
  }
  __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                ,0x436,"void Abc_NtkPrintFactor(FILE *, Abc_Ntk_t *, int)");
}

Assistant:

void Abc_NtkPrintFactor( FILE * pFile, Abc_Ntk_t * pNtk, int fUseRealNames )
{
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsSopLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        Abc_NodePrintFactor( pFile, pNode, fUseRealNames );
}